

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::setRotation(Private_Impl *this,int rotation)

{
  bool bVar1;
  int in_ESI;
  Private_Impl *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  for (; in_ESI < 0; in_ESI = in_ESI + 0x168) {
  }
  if (0x167 < in_ESI) {
    in_ESI = in_ESI % 0x168;
  }
  (in_RDI->State).rotation = in_ESI;
  bVar1 = isOpened(in_RDI);
  if (bVar1) {
    commitRotation((Private_Impl *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void Private_Impl::setRotation ( int rotation ) {
            while ( rotation < 0 )
                rotation += 360;
            if ( rotation >= 360 )
                rotation = rotation % 360;
            State.rotation = rotation;
            if ( isOpened() ) commitRotation();
        }